

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeBitfieldMaskOperand(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  uint32_t in_ESI;
  MCInst *in_RDI;
  DecodeStatus S;
  uint32_t msb_mask;
  uint32_t lsb_mask;
  uint lsb;
  uint msb;
  DecodeStatus local_34;
  uint local_30;
  uint local_2c;
  uint32_t local_28;
  uint local_24;
  uint32_t local_c;
  MCInst *local_8;
  
  local_c = in_ESI;
  local_8 = in_RDI;
  local_24 = fieldFromInstruction_4(in_ESI,5,5);
  local_28 = fieldFromInstruction_4(local_c,0,5);
  local_34 = MCDisassembler_Success;
  if (local_24 < local_28) {
    Check(&local_34,MCDisassembler_SoftFail);
    local_28 = local_24;
  }
  local_30 = 0xffffffff;
  if (local_24 != 0x1f) {
    local_30 = (1 << ((char)local_24 + 1U & 0x1f)) - 1;
  }
  local_2c = (1 << ((byte)local_28 & 0x1f)) - 1;
  MCOperand_CreateImm0(local_8,(ulong)(local_30 ^ local_2c ^ 0xffffffff));
  return local_34;
}

Assistant:

static DecodeStatus DecodeBitfieldMaskOperand(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	// This operand encodes a mask of contiguous zeros between a specified MSB
	// and LSB.  To decode it, we create the mask of all bits MSB-and-lower,
	// the mask of all bits LSB-and-lower, and then xor them to create
	// the mask of that's all ones on [msb, lsb].  Finally we not it to
	// create the final mask.
	unsigned msb = fieldFromInstruction_4(Val, 5, 5);
	unsigned lsb = fieldFromInstruction_4(Val, 0, 5);
	uint32_t lsb_mask, msb_mask;

	DecodeStatus S = MCDisassembler_Success;
	if (lsb > msb) {
		Check(&S, MCDisassembler_SoftFail);
		// The check above will cause the warning for the "potentially undefined
		// instruction encoding" but we can't build a bad MCOperand value here
		// with a lsb > msb or else printing the MCInst will cause a crash.
		lsb = msb;
	}

	msb_mask = 0xFFFFFFFF;
	if (msb != 31) msb_mask = (1U << (msb+1)) - 1;
	lsb_mask = (1U << lsb) - 1;

	MCOperand_CreateImm0(Inst, ~(msb_mask ^ lsb_mask));
	return S;
}